

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

uint parse_hex4(uchar *input)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  
  lVar3 = -4;
  uVar2 = 0;
  while( true ) {
    if (lVar3 == 0) {
      return uVar2;
    }
    bVar1 = input[lVar3 + 4];
    iVar4 = -0x30;
    if (((9 < (byte)(bVar1 - 0x30)) && (iVar4 = -0x37, 5 < (byte)(bVar1 + 0xbf))) &&
       (iVar4 = -0x57, 5 < (byte)(bVar1 + 0x9f))) break;
    uVar5 = iVar4 + uVar2 + (uint)bVar1;
    lVar3 = lVar3 + 1;
    uVar2 = uVar5 * 0x10;
    if (lVar3 == 0) {
      uVar2 = uVar5;
    }
  }
  return 0;
}

Assistant:

static unsigned parse_hex4(const unsigned char * const input)
{
    unsigned int h = 0;
    size_t i = 0;

    for (i = 0; i < 4; i++)
    {
        /* parse digit */
        if ((input[i] >= '0') && (input[i] <= '9'))
        {
            h += (unsigned int) input[i] - '0';
        }
        else if ((input[i] >= 'A') && (input[i] <= 'F'))
        {
            h += (unsigned int) 10 + input[i] - 'A';
        }
        else if ((input[i] >= 'a') && (input[i] <= 'f'))
        {
            h += (unsigned int) 10 + input[i] - 'a';
        }
        else /* invalid */
        {
            return 0;
        }

        if (i < 3)
        {
            /* shift left to make place for the next nibble */
            h = h << 4;
        }
    }

    return h;
}